

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::Unroller<(unsigned_short)50,_(unsigned_short)19>::Unpack
               (uint32_t **in,uint64_t *out)

{
  uint uVar1;
  uint *puVar2;
  
  puVar2 = *in;
  uVar1 = puVar2[2];
  out[0x13] = (ulong)(uVar1 & 0xff) << 0x2a | (ulong)puVar2[1] << 10 | (ulong)(*puVar2 >> 0x16);
  *in = puVar2 + 3;
  out[0x14] = (ulong)(puVar2[3] & 0x3ffffff) << 0x18 | (ulong)(uVar1 >> 8);
  Unroller<(unsigned_short)50,_(unsigned_short)21>::Unpack(in,out);
  return;
}

Assistant:

unpack_single_out(const uint32_t *__restrict &in,
                                                                     uint64_t *__restrict out) {
	*out = static_cast<uint64_t>(*in) >> SHR;
	++in;

	*out |= static_cast<uint64_t>(*in) << (32 - SHR);
	++in;

	if (DELTA + SHR > 64) {
		static const uint8_t NEXT_SHR = DELTA + SHR - 64;
		*out |= static_cast<uint64_t>((*in) % (1U << NEXT_SHR)) << (64 - SHR);
	}
}